

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesn.cc
# Opt level: O0

Channel * __thiscall GOESNImageHandler::loadChannel(GOESNImageHandler *this,NOAALRITHeader *h)

{
  long in_RDX;
  Channel *in_RDI;
  Channel *channel;
  Channel *this_00;
  
  this_00 = in_RDI;
  Channel::Channel(in_RDI);
  if (*(ushort *)(in_RDX + 10) < 0xb) {
    std::__cxx11::string::operator=((string *)this_00,"IR");
    std::__cxx11::string::operator=((string *)&this_00->nameLong,"Infrared");
  }
  else if (*(ushort *)(in_RDX + 10) < 0x15) {
    std::__cxx11::string::operator=((string *)this_00,"VS");
    std::__cxx11::string::operator=((string *)&this_00->nameLong,"Visible");
  }
  else {
    std::__cxx11::string::operator=((string *)this_00,"WV");
    std::__cxx11::string::operator=((string *)&this_00->nameLong,"Water Vapor");
  }
  return in_RDI;
}

Assistant:

Channel GOESNImageHandler::loadChannel(const lrit::NOAALRITHeader& h) const {
  Channel channel;
  if (h.productSubID <= 10) {
    channel.nameShort = "IR";
    channel.nameLong = "Infrared";
  } else if (h.productSubID <= 20) {
    channel.nameShort = "VS";
    channel.nameLong = "Visible";
  } else {
    channel.nameShort = "WV";
    channel.nameLong = "Water Vapor";
  }
  return channel;
}